

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O1

void event_wake_up(tgestate_t *state)

{
  uint8_t *puVar1;
  long lVar2;
  long lVar3;
  
  state->bell = '(';
  queue_message(state,message_TIME_TO_WAKE_UP);
  if (state->hero_in_bed != '\0') {
    state->vischars[0].mi.mappos.u = 0x2e;
    state->vischars[0].mi.mappos.v = 0x2e;
  }
  state->hero_in_bed = '\0';
  if (state->in_solitary == '\0') {
    puVar1 = &state->vischars[0].flags;
    *puVar1 = *puVar1 & 0xbf;
    state->vischars[0].route.index = '*';
    state->vischars[0].route.step = '\0';
    set_route(state,state->vischars);
  }
  lVar3 = 0x1fd;
  do {
    lVar2 = lVar3;
    *(undefined1 *)((long)state->jmpbuf_main[0].__jmpbuf + lVar2 + -0x20) = 3;
    lVar3 = lVar2 + 7;
  } while ((char)(lVar2 + 7) != '\x12');
  *(undefined1 *)((long)state->jmpbuf_main[0].__jmpbuf + lVar2 + -0x19) = 5;
  *(undefined1 *)((long)state->jmpbuf_main[0].__jmpbuf + lVar2 + -0x12) = 5;
  *(undefined1 *)((long)state->jmpbuf_main[0].__jmpbuf + lVar2 + -0xb) = 5;
  set_prisoners_and_guards_route_B(state,(route_t *)&wake_up_t5);
  lVar3 = 0;
  do {
    set_roomdef(state,beds[lVar3].room_index,(uint)beds[lVar3].offset,9);
    lVar3 = lVar3 + 1;
  } while ((char)lVar3 != '\x06');
  set_roomdef(state,'\x02',0x1a,9);
  if ((byte)(state->room_index - 1) < 5) {
    setup_room(state);
    plot_interior_tiles(state);
    return;
  }
  return;
}

Assistant:

static void event_wake_up(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  queue_message(state, message_TIME_TO_WAKE_UP);
  wake_up(state);
}